

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFadds.c
# Opt level: O3

int Gia_ObjFanin0CopyCarry(Vec_Int_t *vCarries,Gia_Obj_t *pObj,int Id)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = (uint)*(undefined8 *)pObj;
  if (vCarries != (Vec_Int_t *)0x0) {
    uVar2 = Id - (uVar1 & 0x1fffffff);
    if (((int)uVar2 < 0) || (vCarries->nSize <= (int)uVar2)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    uVar2 = vCarries->pArray[uVar2];
    if (uVar2 != 0xffffffff) {
      if (-1 < (int)uVar2) {
        return uVar2 ^ uVar1 >> 0x1d & 1;
      }
      goto LAB_006a46df;
    }
  }
  if (-1 < (int)pObj[-(ulong)(uVar1 & 0x1fffffff)].Value) {
    return uVar1 >> 0x1d & 1 ^ pObj[-(ulong)(uVar1 & 0x1fffffff)].Value;
  }
LAB_006a46df:
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                ,0x10f,"int Abc_LitNotCond(int, int)");
}

Assistant:

int Gia_ObjFanin0CopyCarry( Vec_Int_t * vCarries, Gia_Obj_t * pObj, int Id )
{
    if ( vCarries == NULL || Vec_IntEntry(vCarries, Gia_ObjFaninId0(pObj, Id)) == -1 )
        return Gia_ObjFanin0Copy(pObj);
    return Abc_LitNotCond( Vec_IntEntry(vCarries, Gia_ObjFaninId0(pObj, Id)), Gia_ObjFaninC0(pObj) );
}